

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFreeTests(xmlSchematronTestPtr_conflict tests)

{
  xmlSchematronTestPtr pxVar1;
  xmlSchematronTestPtr_conflict next;
  xmlSchematronTestPtr_conflict tests_local;
  
  next = tests;
  while (next != (xmlSchematronTestPtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->test != (xmlChar *)0x0) {
      (*xmlFree)(next->test);
    }
    if (next->comp != (xmlXPathCompExprPtr)0x0) {
      xmlXPathFreeCompExpr(next->comp);
    }
    if (next->report != (xmlChar *)0x0) {
      (*xmlFree)(next->report);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchematronFreeTests(xmlSchematronTestPtr tests) {
    xmlSchematronTestPtr next;

    while (tests != NULL) {
        next = tests->next;
        if (tests->test != NULL)
            xmlFree(tests->test);
        if (tests->comp != NULL)
            xmlXPathFreeCompExpr(tests->comp);
        if (tests->report != NULL)
            xmlFree(tests->report);
        xmlFree(tests);
        tests = next;
    }
}